

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::ItoRFunction::eval
          (ItoRFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  EvalContext *in_RDI;
  ConstantValue val;
  EvalContext *context_00;
  ConstantValue *in_stack_ffffffffffffffa8;
  
  context_00 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval((Expression *)&stack0xffffffffffffffa8,context_00);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xae898b);
  if (bVar1) {
    slang::ConstantValue::convertToReal(in_stack_ffffffffffffffa8);
  }
  else {
    slang::ConstantValue::ConstantValue((ConstantValue *)context_00,in_RDI);
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xae89f0);
  return (ConstantValue *)context_00;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto val = args[0]->eval(context);
        if (!val)
            return nullptr;

        return val.convertToReal();
    }